

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

shared_ptr<const_mathiu::impl::Expr> __thiscall
mathiu::impl::mergeSum<mathiu::impl::Sum>(impl *this,Sum *c1,Sum *c2)

{
  size_type sVar1;
  reference ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_mathiu::impl::Expr> sVar3;
  _Rb_tree_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_88 [3];
  shared_ptr<const_mathiu::impl::Expr> local_70;
  undefined1 local_58 [8];
  Sum result;
  anon_class_1_0_00000001 add;
  Sum *c2_local;
  Sum *c1_local;
  
  result.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  operator____i((impl *)&local_70,0);
  merge<mathiu::impl::Sum,mathiu::impl::mergeSum<mathiu::impl::Sum>(mathiu::impl::Sum_const&,mathiu::impl::Sum_const&)::_lambda(auto:1&&,auto:2&&)_1_,std::shared_ptr<mathiu::impl::Expr_const>>
            (local_58,(impl *)c1,c2,(impl *)&local_70);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_70);
  sVar1 = std::
          map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
          ::size((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)local_58);
  if (sVar1 == 1) {
    local_88[0]._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
         ::begin((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)local_58);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
             ::operator*(local_88);
    std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr
              ((shared_ptr<const_mathiu::impl::Expr> *)this,&ppVar2->second);
  }
  else {
    makeSharedExprPtr<mathiu::impl::Sum>((Sum *)this);
  }
  Sum::~Sum((Sum *)local_58);
  sVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_mathiu::impl::Expr>)
         sVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto mergeSum(C const &c1, C const &c2)
    {
        constexpr auto add = [](auto &&lhs, auto &&rhs)
        { return lhs + rhs; };
        auto result = merge(c1, c2, add, 0_i);
        ;
        if (result.size() == 1)
        {
            return (*result.begin()).second;
        }
        return makeSharedExprPtr(std::move(result));
    }